

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_20c5e7::LineEdit::handleReturnPressed(LineEdit *this)

{
  long lVar1;
  QArrayData *pQVar2;
  long in_FS_OFFSET;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  qsizetype local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QLineEdit::text();
  pQVar2 = &((this->origText).d.d)->super_QArrayData;
  *(undefined4 *)&(this->origText).d.d = local_38;
  *(undefined4 *)((long)&(this->origText).d.d + 4) = uStack_34;
  *(undefined4 *)&(this->origText).d.ptr = uStack_30;
  *(undefined4 *)((long)&(this->origText).d.ptr + 4) = uStack_2c;
  (this->origText).d.size = local_28;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void handleReturnPressed()
    {
        origText = text();
    }